

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_ATMOS.cpp
# Opt level: O3

h__Reader * __thiscall
ASDCP::ATMOS::MXFReader::h__Reader::OpenRead(h__Reader *this,string *filename)

{
  int iVar1;
  int iVar2;
  MDDEntry *pMVar3;
  ILogSink *pIVar4;
  long lVar5;
  undefined1 *this_00;
  InterchangeObject *iObj;
  Result_t result;
  undefined1 local_e8 [104];
  ui32_t local_80;
  
  this_00 = (undefined1 *)&stack0xffffffffffffff80;
  h__ASDCPReader::OpenMXFRead((h__ASDCPReader *)this_00,filename);
  *(undefined8 *)((long)&filename[0x32].field_2 + 8) = 0;
  if ((int)local_80 < 0) {
LAB_001e0858:
    pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar4,"DCDataDescriptor object not found in Atmos file.\n");
    Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff80,(Result_t *)ASDCP::RESULT_FORMAT)
    ;
  }
  else {
    pMVar3 = Dictionary::Type((Dictionary *)filename->_M_string_length,MDD_PrivateDCDataDescriptor);
    MXF::OP1aHeader::GetMDObjectByType
              ((OP1aHeader *)local_e8,(byte_t *)((filename->field_2)._M_local_buf + 8),
               (InterchangeObject **)pMVar3);
    Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff80,(Result_t *)local_e8);
    Kumu::Result_t::~Result_t((Result_t *)local_e8);
    if ((int)local_80 < 0) {
      lVar5 = *(long *)((long)&filename[0x32].field_2 + 8);
    }
    else {
      lVar5 = 0;
      *(undefined8 *)((long)&filename[0x32].field_2 + 8) = 0;
    }
    if (lVar5 == 0) goto LAB_001e0858;
  }
  if (-1 < (int)local_80) {
    MD_to_DCData_DDesc((h__Reader *)local_e8,(DCDataDescriptor *)filename);
    this_00 = (undefined1 *)&stack0xffffffffffffff80;
    Kumu::Result_t::operator=((Result_t *)this_00,(Result_t *)local_e8);
    Kumu::Result_t::~Result_t((Result_t *)local_e8);
    if (-1 < (int)local_80) {
      iVar1 = (int)filename[0x33]._M_string_length;
      iVar2 = *(int *)((long)&filename[0x33]._M_string_length + 4);
      if ((((((ASDCP::EditRate_24 == iVar1) && (DAT_002550d4 == iVar2)) ||
            ((ASDCP::EditRate_25 == iVar1 && (DAT_002550fc == iVar2)))) ||
           ((ASDCP::EditRate_30 == iVar1 && (DAT_00255104 == iVar2)))) ||
          ((((ASDCP::EditRate_48 == iVar1 && (DAT_002550e4 == iVar2)) ||
            (((ASDCP::EditRate_50 == iVar1 && (DAT_0025510c == iVar2)) ||
             ((ASDCP::EditRate_60 == iVar1 && (DAT_00255114 == iVar2)))))) ||
           (((ASDCP::EditRate_96 == iVar1 && (DAT_0025511c == iVar2)) ||
            ((ASDCP::EditRate_100 == iVar1 && (DAT_00255124 == iVar2)))))))) ||
         ((((ASDCP::EditRate_120 == iVar1 && (DAT_0025512c == iVar2)) ||
           ((ASDCP::EditRate_192 == iVar1 && (DAT_00255134 == iVar2)))) ||
          (((ASDCP::EditRate_200 == iVar1 && (DAT_0025513c == iVar2)) ||
           ((ASDCP::EditRate_240 == iVar1 && (DAT_00255144 == iVar2)))))))) {
        if (filename[0x33]._M_dataplus._M_p == (pointer)0x0) {
          pMVar3 = Dictionary::Type((Dictionary *)filename->_M_string_length,
                                    MDD_DolbyAtmosSubDescriptor);
          MXF::OP1aHeader::GetMDObjectByType
                    ((OP1aHeader *)local_e8,(byte_t *)((filename->field_2)._M_local_buf + 8),
                     (InterchangeObject **)pMVar3);
          Kumu::Result_t::operator=((Result_t *)&stack0xffffffffffffff80,(Result_t *)local_e8);
          Kumu::Result_t::~Result_t((Result_t *)local_e8);
          filename[0x33]._M_dataplus._M_p = (pointer)0x0;
          pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
          Kumu::ILogSink::Error(pIVar4,"DolbyAtmosSubDescriptor object not found.\n");
          Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
          goto LAB_001e09f1;
        }
        MD_to_Atmos_ADesc((h__Reader *)local_e8,(AtmosDescriptor *)filename);
        this_00 = (undefined1 *)&stack0xffffffffffffff80;
        Kumu::Result_t::operator=((Result_t *)this_00,(Result_t *)local_e8);
        Kumu::Result_t::~Result_t((Result_t *)local_e8);
      }
      else {
        pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error
                  (pIVar4,"DC Data file EditRate is not a supported value: %d/%d\n",
                   (ulong)(uint)filename[0x33]._M_string_length,
                   (ulong)*(uint *)((long)&filename[0x33]._M_string_length + 4));
        this_00 = ASDCP::RESULT_FORMAT;
      }
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)this_00);
LAB_001e09f1:
  Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff80);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::ATMOS::MXFReader::h__Reader::OpenRead(const std::string& filename)
{
  Result_t result = OpenMXFRead(filename);
  m_EssenceDescriptor = 0;

  if ( KM_SUCCESS(result) )
    {
      InterchangeObject* iObj = 0;
      result = m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(PrivateDCDataDescriptor), &iObj);

      if ( KM_SUCCESS(result) )
	{
	  m_EssenceDescriptor = static_cast<MXF::PrivateDCDataDescriptor*>(iObj);
	}
    }

  if ( m_EssenceDescriptor == 0 )
    {
      DefaultLogSink().Error("DCDataDescriptor object not found in Atmos file.\n");
      result = RESULT_FORMAT;
    }

  if ( KM_SUCCESS(result) )
    {
      result = MD_to_DCData_DDesc(m_DDesc);
    }

  // check for sample/frame rate sanity
  if ( ASDCP_SUCCESS(result)
       && m_DDesc.EditRate != EditRate_24
       && m_DDesc.EditRate != EditRate_25
       && m_DDesc.EditRate != EditRate_30
       && m_DDesc.EditRate != EditRate_48
       && m_DDesc.EditRate != EditRate_50
       && m_DDesc.EditRate != EditRate_60
       && m_DDesc.EditRate != EditRate_96
       && m_DDesc.EditRate != EditRate_100
       && m_DDesc.EditRate != EditRate_120
       && m_DDesc.EditRate != EditRate_192
       && m_DDesc.EditRate != EditRate_200
       && m_DDesc.EditRate != EditRate_240 )
  {
    DefaultLogSink().Error("DC Data file EditRate is not a supported value: %d/%d\n", // lu
                           m_DDesc.EditRate.Numerator, m_DDesc.EditRate.Denominator);

    return RESULT_FORMAT;
  }

  if( ASDCP_SUCCESS(result) )
    {
      
      if (NULL == m_EssenceSubDescriptor)
	{
	  InterchangeObject* iObj = NULL;
	  result = m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(DolbyAtmosSubDescriptor), &iObj);
	  m_EssenceSubDescriptor = static_cast<MXF::DolbyAtmosSubDescriptor*>(iObj);
	  
	  if ( iObj == 0 )
	    {
	      DefaultLogSink().Error("DolbyAtmosSubDescriptor object not found.\n");
	      return RESULT_FORMAT;
	    }
	}

      if ( ASDCP_SUCCESS(result) )
	{
	  result = MD_to_Atmos_ADesc(m_ADesc);
	}
    }

  return result;
}